

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O0

Matrix3d * opengv::generateRandomRotation(double maxAngle)

{
  Scalar SVar1;
  int iVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  Matrix3d *in_RDI;
  double in_XMM0_Qa;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *this_00;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *this_01;
  double dVar5;
  Matrix3d R3;
  Matrix3d R2;
  Matrix3d R1;
  Vector3d rpy;
  Matrix3d *rotation;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffa28;
  double *scalar;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  *in_stack_fffffffffffffb10;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  *in_stack_fffffffffffffb18;
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x3b6118);
  iVar2 = rand();
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)((double)iVar2 / 2147483647.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  *pSVar3 = (Scalar)this;
  iVar2 = rand();
  other = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)((double)iVar2 / 2147483647.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  *pSVar3 = (Scalar)other;
  iVar2 = rand();
  this_00 = (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
             *)((double)iVar2 / 2147483647.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  *pSVar3 = (Scalar)this_00;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  *pSVar3 = in_XMM0_Qa * 2.0 * (dVar5 - 0.5);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  *pSVar3 = in_XMM0_Qa * 2.0 * (dVar5 - 0.5);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  scalar = (double *)(in_XMM0_Qa * 2.0 * (*pSVar3 - 0.5));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  *pSVar3 = (Scalar)scalar;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x3b62f6);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b630a);
  *pSVar4 = 1.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b632c);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b634a);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6368);
  *pSVar4 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  this_01 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
            cos(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b63a5);
  *pSVar4 = (Scalar)this_01;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  dVar5 = sin(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b63fd);
  *pSVar4 = -dVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b641d);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b643c);
  SVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6474);
  *pSVar4 = -SVar1;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6493);
  SVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b64b2);
  *pSVar4 = SVar1;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x3b64c9);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  dVar5 = cos(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b64fe);
  *pSVar4 = dVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b651e);
  *pSVar4 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  dVar5 = sin(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b655d);
  *pSVar4 = dVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b657d);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b659a);
  *pSVar4 = 1.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b65bd);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b65db);
  SVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6615);
  *pSVar4 = -SVar1;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6639);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6655);
  SVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6677);
  *pSVar4 = SVar1;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x3b6691);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  dVar5 = cos(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b66c9);
  *pSVar4 = dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)in_stack_fffffffffffffa28);
  dVar5 = sin(*pSVar3);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6727);
  *pSVar4 = -dVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b674a);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6768);
  SVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b67a2);
  *pSVar4 = -SVar1;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b67c3);
  SVar1 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b67e5);
  *pSVar4 = SVar1;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6809);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6827);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6846);
  *pSVar4 = 0.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      (Index)in_stack_fffffffffffffa28,0x3b6863);
  *pSVar4 = 1.0;
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffa28);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>::
  operator*(this_00,other);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)this,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)in_stack_fffffffffffffa28);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffffa28);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
            (this_01,scalar);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)this,
             in_stack_fffffffffffffa28);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::
  cross<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)this,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa28);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffffa28);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
            (this_01,scalar);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)this,
             in_stack_fffffffffffffa28);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::
  cross<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)this,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa28);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_fffffffffffffa28);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::operator/
            (this_01,scalar);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,(Index)other);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)this,
             in_stack_fffffffffffffa28);
  return in_RDI;
}

Assistant:

Eigen::Matrix3d
opengv::generateRandomRotation( double maxAngle )
{
  Eigen::Vector3d rpy;
  rpy[0] = ((double) rand())/ ((double) RAND_MAX);
  rpy[1] = ((double) rand())/ ((double) RAND_MAX);
  rpy[2] = ((double) rand())/ ((double) RAND_MAX);

  rpy[0] = maxAngle*2.0*(rpy[0]-0.5);
  rpy[1] = maxAngle*2.0*(rpy[1]-0.5);
  rpy[2] = maxAngle*2.0*(rpy[2]-0.5);

  Matrix3d R1;
  R1(0,0) = 1.0;
  R1(0,1) = 0.0;
  R1(0,2) = 0.0;
  R1(1,0) = 0.0;
  R1(1,1) = cos(rpy[0]);
  R1(1,2) = -sin(rpy[0]);
  R1(2,0) = 0.0;
  R1(2,1) = -R1(1,2);
  R1(2,2) = R1(1,1);

  Matrix3d R2;
  R2(0,0) = cos(rpy[1]);
  R2(0,1) = 0.0;
  R2(0,2) = sin(rpy[1]);
  R2(1,0) = 0.0;
  R2(1,1) = 1.0;
  R2(1,2) = 0.0;
  R2(2,0) = -R2(0,2);
  R2(2,1) = 0.0;
  R2(2,2) = R2(0,0);

  Matrix3d R3;
  R3(0,0) = cos(rpy[2]);
  R3(0,1) = -sin(rpy[2]);
  R3(0,2) = 0.0;
  R3(1,0) =-R3(0,1);
  R3(1,1) = R3(0,0);
  R3(1,2) = 0.0;
  R3(2,0) = 0.0;
  R3(2,1) = 0.0;
  R3(2,2) = 1.0;

  Matrix3d rotation = R3 * R2 * R1;

  rotation.col(0) = rotation.col(0) / rotation.col(0).norm();
  rotation.col(2) = rotation.col(0).cross(rotation.col(1));
  rotation.col(2) = rotation.col(2) / rotation.col(2).norm();
  rotation.col(1) = rotation.col(2).cross(rotation.col(0));
  rotation.col(1) = rotation.col(1) / rotation.col(1).norm();

  return rotation;
}